

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

void amrex::FArrayBox::setFormat(Format fmt)

{
  int iVar1;
  _func_int **pp_Var2;
  FABio *rd;
  RealDescriptor *pRVar3;
  undefined4 extraout_var_00;
  ostream *poVar4;
  undefined4 extraout_var_01;
  undefined **ppuVar5;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  __fn *in_RSI;
  void *in_R8;
  undefined4 extraout_var;
  
  iVar1 = 0x714d74;
  switch(fmt) {
  case FAB_ASCII:
    rd = (FABio *)operator_new(8);
    ppuVar5 = &PTR__FABio_007d3e98;
    goto LAB_00517bff;
  case FAB_IEEE:
  case FAB_IEEE_32:
    rd = (FABio *)operator_new(0x10);
    pRVar3 = FPC::Ieee32NormalRealDescriptor();
    iVar1 = RealDescriptor::clone(pRVar3,in_RSI,__child_stack,iVar1,in_R8);
    pp_Var2 = (_func_int **)CONCAT44(extraout_var,iVar1);
    break;
  case FAB_NATIVE:
    rd = (FABio *)operator_new(0x10);
    pRVar3 = FPC::NativeRealDescriptor();
    iVar1 = RealDescriptor::clone(pRVar3,in_RSI,__child_stack_01,iVar1,in_R8);
    pp_Var2 = (_func_int **)CONCAT44(extraout_var_01,iVar1);
    break;
  default:
    poVar4 = ErrorStream();
    poVar4 = std::operator<<(poVar4,"FArrayBox::setFormat(): Bad FABio::Format = ");
    std::ostream::operator<<(poVar4,fmt);
    rd = (FABio *)0x0;
    Abort_host((char *)0x0);
    goto LAB_00517c02;
  case FAB_8BIT:
    rd = (FABio *)operator_new(8);
    ppuVar5 = &PTR__FABio_007d3f50;
LAB_00517bff:
    rd->_vptr_FABio = (_func_int **)ppuVar5;
    goto LAB_00517c02;
  case FAB_NATIVE_32:
    rd = (FABio *)operator_new(0x10);
    pRVar3 = FPC::Native32RealDescriptor();
    iVar1 = RealDescriptor::clone(pRVar3,in_RSI,__child_stack_00,iVar1,in_R8);
    pp_Var2 = (_func_int **)CONCAT44(extraout_var_00,iVar1);
  }
  rd->_vptr_FABio = (_func_int **)&PTR__FABio_binary_007d3e50;
  rd[1]._vptr_FABio = pp_Var2;
LAB_00517c02:
  format = fmt;
  setFABio(rd);
  return;
}

Assistant:

void
FArrayBox::setFormat (FABio::Format fmt)
{
    FABio* fio = 0;

    switch (fmt)
    {
    case FABio::FAB_ASCII:
        fio = new FABio_ascii;
        break;
    case FABio::FAB_8BIT:
        fio = new FABio_8bit;
        break;
    case FABio::FAB_NATIVE:
        fio = new FABio_binary(FPC::NativeRealDescriptor().clone());
        break;
    case FABio::FAB_IEEE:
        //amrex::Warning("FABio::FAB_IEEE has been deprecated");
        //
        // Fall through ...
        //
    case FABio::FAB_IEEE_32:
        fio = new FABio_binary(FPC::Ieee32NormalRealDescriptor().clone());
        break;
    case FABio::FAB_NATIVE_32:
        fio = new FABio_binary(FPC::Native32RealDescriptor().clone());
        break;
    default:
        amrex::ErrorStream() << "FArrayBox::setFormat(): Bad FABio::Format = " << fmt;
        amrex::Abort();
    }

    FArrayBox::format = fmt;

    setFABio(fio);
}